

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__load_main(stbi__context *s,int *x,int *y,int *comp,int req_comp,stbi__result_info *ri,
                      int param_7)

{
  int iVar1;
  void *pvVar2;
  stbi__result_info *in_RCX;
  undefined8 in_RDX;
  stbi__result_info *in_RSI;
  int *in_RDI;
  undefined4 in_R8D;
  undefined4 *in_R9;
  undefined4 in_stack_00000008;
  undefined4 in_stack_ffffffffffffffd0;
  int req_comp_00;
  int *in_stack_fffffffffffffff8;
  
  req_comp_00 = (int)((ulong)in_RDX >> 0x20);
  memset(in_R9,0,0xc);
  *in_R9 = 8;
  in_R9[2] = 0;
  in_R9[1] = 0;
  iVar1 = stbi__jpeg_test((stbi__context *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
  if (iVar1 == 0) {
    iVar1 = stbi__png_test((stbi__context *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0));
    if (iVar1 == 0) {
      stbi__err("unknown image type");
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = stbi__png_load((stbi__context *)comp,(int *)CONCAT44(req_comp,in_stack_00000008),
                              &ri->bits_per_channel,in_stack_fffffffffffffff8,
                              (int)((ulong)in_RDI >> 0x20),in_RSI);
    }
  }
  else {
    pvVar2 = stbi__jpeg_load((stbi__context *)ri,in_stack_fffffffffffffff8,in_RDI,
                             &in_RSI->bits_per_channel,req_comp_00,in_RCX);
  }
  return pvVar2;
}

Assistant:

static void *stbi__load_main(stbi__context *s, int *x, int *y, int *comp, int req_comp, stbi__result_info *ri, int /*bpc*/)
{
   memset(ri, 0, sizeof(*ri)); // make sure it's initialized if we add new fields
   ri->bits_per_channel = 8; // default is 8 so most paths don't have to be changed
   ri->channel_order = STBI_ORDER_RGB; // all current input & output are this, but this is here so we can add BGR order
   ri->num_channels = 0;

   #ifndef STBI_NO_JPEG
   if (stbi__jpeg_test(s)) return stbi__jpeg_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNG
   if (stbi__png_test(s))  return stbi__png_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_BMP
   if (stbi__bmp_test(s))  return stbi__bmp_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_GIF
   if (stbi__gif_test(s))  return stbi__gif_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PSD
   if (stbi__psd_test(s))  return stbi__psd_load(s,x,y,comp,req_comp, ri, bpc);
   #endif
   #ifndef STBI_NO_PIC
   if (stbi__pic_test(s))  return stbi__pic_load(s,x,y,comp,req_comp, ri);
   #endif
   #ifndef STBI_NO_PNM
   if (stbi__pnm_test(s))  return stbi__pnm_load(s,x,y,comp,req_comp, ri);
   #endif

   #ifndef STBI_NO_HDR
   if (stbi__hdr_test(s)) {
      float *hdr = stbi__hdr_load(s, x,y,comp,req_comp, ri);
      return stbi__hdr_to_ldr(hdr, *x, *y, req_comp ? req_comp : *comp);
   }
   #endif

   #ifndef STBI_NO_TGA
   // test tga last because it's a crappy test!
   if (stbi__tga_test(s))
      return stbi__tga_load(s,x,y,comp,req_comp, ri);
   #endif

   return stbi__errpuc("unknown image type", "Image not of any known type, or corrupt");
}